

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O2

void __thiscall
ThreadContext::UnregisterIsInstInlineCache
          (ThreadContext *this,IsInstInlineCache *inlineCache,Var function)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  IsInstInlineCache *pIVar4;
  IsInstInlineCache *pIVar5;
  Var local_30;
  Var function_local;
  IsInstInlineCache **inlineCacheRef;
  
  local_30 = function;
  if (inlineCache == (IsInstInlineCache *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0xf12,"(inlineCache != nullptr)","inlineCache != nullptr");
    if (!bVar2) goto LAB_00715989;
    *puVar3 = 0;
  }
  function_local = (Var)0x0;
  bVar2 = JsUtil::
          BaseDictionary<void*,Js::IsInstInlineCache*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<void*>
                    ((BaseDictionary<void*,Js::IsInstInlineCache*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)&this->isInstInlineCacheByFunction,&local_30,
                     (IsInstInlineCache ***)&function_local);
  if (bVar2) {
    pIVar4 = *function_local;
    if (pIVar4 == (IsInstInlineCache *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                         ,0xf17,"(*inlineCacheRef != nullptr)","*inlineCacheRef != nullptr");
      if (!bVar2) {
LAB_00715989:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      pIVar4 = *function_local;
    }
    if (pIVar4 == inlineCache) {
      *(IsInstInlineCache **)function_local = pIVar4->next;
      if (*function_local == 0) {
        JsUtil::
        BaseDictionary<void_*,_Js::IsInstInlineCache_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::Remove(&this->isInstInlineCacheByFunction,&local_30);
      }
    }
    else {
      do {
        pIVar5 = pIVar4;
        pIVar4 = pIVar5->next;
        if (pIVar4 == (IsInstInlineCache *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar3 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                             ,0xf2d,"(false)",
                             "Why are we unregistering a cache that is not registered?");
          if (bVar2) {
            *puVar3 = 0;
            return;
          }
          goto LAB_00715989;
        }
      } while (pIVar4 != inlineCache);
      pIVar5->next = pIVar4->next;
    }
  }
  return;
}

Assistant:

void
ThreadContext::UnregisterIsInstInlineCache(Js::IsInstInlineCache * inlineCache, Js::Var function)
{
    Assert(inlineCache != nullptr);
    Js::IsInstInlineCache** inlineCacheRef = nullptr;

    if (this->isInstInlineCacheByFunction.TryGetReference(function, &inlineCacheRef))
    {
        Assert(*inlineCacheRef != nullptr);
        if (inlineCache == *inlineCacheRef)
        {
            *inlineCacheRef = (*inlineCacheRef)->next;
            if (*inlineCacheRef == nullptr)
            {
                this->isInstInlineCacheByFunction.Remove(function);
            }
        }
        else
        {
            Js::IsInstInlineCache * prevInlineCache;
            Js::IsInstInlineCache * curInlineCache;
            for (prevInlineCache = *inlineCacheRef, curInlineCache = (*inlineCacheRef)->next; curInlineCache != nullptr;
                prevInlineCache = curInlineCache, curInlineCache = curInlineCache->next)
            {
                if (curInlineCache == inlineCache)
                {
                    prevInlineCache->next = curInlineCache->next;
                    return;
                }
            }
            AssertMsg(false, "Why are we unregistering a cache that is not registered?");
        }
    }
}